

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang.cpp
# Opt level: O2

bool fs_is_optimized(void)

{
  return false;
}

Assistant:

bool fs_is_optimized(){
// This is a heuristic, trusting the build system or user to set NDEBUG if optimized.
// The NDEBUG macro is typically defined when optimizations are enabled to disable debugging code.
// It is a standard way to indicate that the code should be optimized and not include debug information.
#if defined(NDEBUG)
  return true;
#else
  return false;
#endif
}